

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Logistics_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Logistics_Header *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Receiving Entity ID:\t",0x15);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->m_ReceivingEntity);
  UTILS::IndentString(&local_200,&local_1c0,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSupplying Entity ID:\t",0x16);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_SupplyingEntity);
  UTILS::IndentString(&local_220,&local_1e0,Tabs_00,in_CL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Logistics_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Receiving Entity ID:	"
       << IndentString( m_ReceivingEntity.GetAsString(), 1 )
       << "\tSupplying Entity ID:	"
       << IndentString( m_SupplyingEntity.GetAsString(), 1 ) ;

    return ss.str();
}